

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O1

void __thiscall CServerBrowser::AddFavorite(CServerBrowser *this,CServerInfo *pInfo)

{
  uint uVar1;
  bool bVar2;
  CServerEntry *pCVar3;
  int i;
  uint ServerlistType;
  
  ServerlistType = 0;
  bVar2 = CServerBrowserFavorites::AddFavoriteEx
                    (&this->m_ServerBrowserFavorites,pInfo->m_aHostname,&pInfo->m_NetAddr,true,
                     (char *)0x0);
  if (bVar2) {
    do {
      pCVar3 = Find(this,ServerlistType,&pInfo->m_NetAddr);
      if (pCVar3 != (CServerEntry *)0x0) {
        (pCVar3->m_Info).m_Favorite = true;
        uVar1 = this->m_ActServerlistType;
        if (ServerlistType == uVar1) {
          CServerBrowserFilter::Sort
                    (&this->m_ServerBrowserFilter,this->m_aServerlist[uVar1].m_ppServerlist,
                     this->m_aServerlist[uVar1].m_NumServers,2);
        }
      }
      ServerlistType = ServerlistType + 1;
    } while (ServerlistType == 1);
  }
  return;
}

Assistant:

void CServerBrowser::AddFavorite(const CServerInfo *pInfo)
{
	if(m_ServerBrowserFavorites.AddFavoriteEx(pInfo->m_aHostname, &pInfo->m_NetAddr, true))
	{
		for(int i = 0; i < NUM_TYPES; ++i)
		{
			CServerEntry *pEntry = Find(i, pInfo->m_NetAddr);
			if(pEntry)
			{
				pEntry->m_Info.m_Favorite = true;

				// refresh servers in all filters where favorites are filtered
				if(i == m_ActServerlistType)
					m_ServerBrowserFilter.Sort(m_aServerlist[m_ActServerlistType].m_ppServerlist, m_aServerlist[m_ActServerlistType].m_NumServers, CServerBrowserFilter::RESORT_FLAG_FAV);
			}
		}
	}
}